

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

pointer __thiscall
google::protobuf::internal::
MapAllocator<std::_Rb_tree_node<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>_>
::allocate(MapAllocator<std::_Rb_tree_node<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>_>
           *this,size_type n,void *param_2)

{
  void *param_2_local;
  size_type n_local;
  MapAllocator<std::_Rb_tree_node<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>_>
  *this_local;
  
  if (this->arena_ == (Arena *)0x0) {
    this_local = (MapAllocator<std::_Rb_tree_node<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>_>
                  *)operator_new(n * 0x30);
  }
  else {
    this_local = (MapAllocator<std::_Rb_tree_node<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>_>
                  *)Arena::CreateArray<unsigned_char>(this->arena_,n * 0x30);
  }
  return (pointer)this_local;
}

Assistant:

pointer allocate(size_type n, const void* /* hint */ = nullptr) {
    // If arena is not given, malloc needs to be called which doesn't
    // construct element object.
    if (arena_ == nullptr) {
      return static_cast<pointer>(::operator new(n * sizeof(value_type)));
    } else {
      return reinterpret_cast<pointer>(
          Arena::CreateArray<uint8_t>(arena_, n * sizeof(value_type)));
    }
  }